

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractslider.cpp
# Opt level: O1

void __thiscall
QAbstractSlider::setRepeatAction
          (QAbstractSlider *this,SliderAction action,int thresholdTime,int repeatTime)

{
  long lVar1;
  
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  *(SliderAction *)(lVar1 + 0x28c) = action;
  if (action != SliderNoAction) {
    *(int *)(lVar1 + 0x288) = repeatTime;
    QBasicTimer::start(lVar1 + 0x284,(long)thresholdTime * 1000000,1,this);
    return;
  }
  QBasicTimer::stop();
  return;
}

Assistant:

void QAbstractSlider::setRepeatAction(SliderAction action, int thresholdTime, int repeatTime)
{
    Q_D(QAbstractSlider);
    if ((d->repeatAction = action) == SliderNoAction) {
        d->repeatActionTimer.stop();
    } else {
        d->repeatActionTime = repeatTime;
        d->repeatActionTimer.start(thresholdTime, this);
    }
}